

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O2

NodeAVL * avlGoUp(NodeAVL *nd)

{
  NodeAVL *pNVar1;
  
  while (pNVar1 = nd->parent, pNVar1 != (NodeAVL *)0x0) {
    pNVar1->tmp = nd;
    nd = pNVar1;
  }
  return nd;
}

Assistant:

static
NodeAVL* avlGoUp( NodeAVL* nd ){
    #ifdef DEBUG_AVL
      printf( "avlGoUp id=%d\n", nd->id );
    #endif
    if ( !nd->parent ) return nd;
    nd->parent->tmp = nd;
    return avlGoUp( nd->parent );
}